

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGValidateValueList(xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict defines)

{
  int iVar1;
  
  while( true ) {
    if (defines == (xmlRelaxNGDefinePtr_conflict)0x0) {
      return 0;
    }
    iVar1 = xmlRelaxNGValidateValue(ctxt,defines);
    if (iVar1 != 0) break;
    defines = defines->next;
  }
  return iVar1;
}

Assistant:

static int
xmlRelaxNGValidateValueList(xmlRelaxNGValidCtxtPtr ctxt,
                            xmlRelaxNGDefinePtr defines)
{
    int ret = 0;

    while (defines != NULL) {
        ret = xmlRelaxNGValidateValue(ctxt, defines);
        if (ret != 0)
            break;
        defines = defines->next;
    }
    return (ret);
}